

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall wasm::PrintExpressionContents::visitDrop(PrintExpressionContents *this,Drop *curr)

{
  ulong uVar1;
  ostream *poVar2;
  
  uVar1 = (curr->value->type).id;
  poVar2 = this->o;
  Colors::outputColorCode(poVar2,"\x1b[35m");
  Colors::outputColorCode(poVar2,"\x1b[1m");
  if ((uVar1 & 1) != 0 && 6 < uVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"tuple.drop ",0xb);
    Colors::outputColorCode(poVar2,"\x1b[0m");
    poVar2 = this->o;
    wasm::Type::size(&curr->value->type);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"drop",4);
  Colors::outputColorCode(poVar2,"\x1b[0m");
  return;
}

Assistant:

void visitDrop(Drop* curr) {
    if (curr->value->type.isTuple()) {
      printMedium(o, "tuple.drop ");
      o << curr->value->type.size();
    } else {
      printMedium(o, "drop");
    }
  }